

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setTimeProperty
          (CommonCore *this,LocalFederateId federateID,int32_t property,Time time)

{
  FederateState *this_00;
  InvalidParameter *this_01;
  pointer_____offset_0x10___ *ppuVar1;
  string_view message;
  string_view message_00;
  ActionMessage cmd;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidParameter *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid (setTimeDelta)";
    message._M_len = 0x23;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar1 = &InvalidIdentifier::typeinfo;
  }
  else {
    if (-1 < time.internalTimeCode) {
      ActionMessage::ActionMessage(&cmd,cmd_fed_configure_time);
      cmd.messageID = property;
      cmd.actionTime.internalTimeCode = time.internalTimeCode;
      FederateState::setProperties(this_00,&cmd);
      ActionMessage::~ActionMessage(&cmd);
      return;
    }
    this_01 = (InvalidParameter *)__cxa_allocate_exception(0x28);
    message_00._M_str = "time properties must be greater than or equal to zero";
    message_00._M_len = 0x35;
    InvalidParameter::InvalidParameter(this_01,message_00);
    ppuVar1 = &InvalidParameter::typeinfo;
  }
  __cxa_throw(this_01,ppuVar1,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setTimeProperty(LocalFederateId federateID, int32_t property, Time time)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    if (time < timeZero) {
        throw(InvalidParameter("time properties must be greater than or equal to zero"));
    }

    ActionMessage cmd(CMD_FED_CONFIGURE_TIME);
    cmd.messageID = property;
    cmd.actionTime = time;
    fed->setProperties(cmd);
}